

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double __thiscall despot::Parser::GetReward(Parser *this,ACT_TYPE action)

{
  pointer pFVar1;
  long lVar2;
  int r;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  dVar5 = 0.0;
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pFVar1 = (this->reward_funcs_).
             super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(this->reward_funcs_).
                  super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pFVar1;
    if ((ulong)(lVar2 / 0x58) <= uVar3) break;
    dVar6 = (double)(**(code **)(*(long *)((long)&pFVar1->_vptr_Function + lVar4) + 0x28))
                              ((long)&pFVar1->_vptr_Function + lVar4,0,lVar2 % 0x58);
    dVar5 = dVar5 + dVar6;
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x58;
  }
  return dVar5;
}

Assistant:

double Parser::GetReward(ACT_TYPE action) const {
	action_vars_[0].curr_value = action;

	double reward = 0;
	for (int r = 0; r < reward_funcs_.size(); r++)
		reward += reward_funcs_[r].GetValue();
	return reward;
}